

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

file_type llvm::sys::fs::get_file_type(Twine *Path,bool Follow)

{
  bool bVar1;
  error_code eVar2;
  error_code local_78;
  undefined1 local_68 [8];
  file_status st;
  bool Follow_local;
  Twine *Path_local;
  
  st.fs_st_ino._7_1_ = Follow;
  file_status::file_status((file_status *)local_68);
  eVar2 = status(Path,(file_status *)local_68,(bool)(st.fs_st_ino._7_1_ & 1));
  local_78._M_cat = eVar2._M_cat;
  local_78._M_value = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool(&local_78);
  if (bVar1) {
    Path_local._4_4_ = status_error;
  }
  else {
    Path_local._4_4_ = basic_file_status::type((basic_file_status *)local_68);
  }
  return Path_local._4_4_;
}

Assistant:

file_type get_file_type(const Twine &Path, bool Follow) {
  file_status st;
  if (status(Path, st, Follow))
    return file_type::status_error;
  return st.type();
}